

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.hpp
# Opt level: O2

void bits::test_radixsort<unsigned_long,unsigned_int,8u>
               (_func_uint32_t_unsigned_long_ptr_unsigned_long_ptr_uint_ptr_uint_ptr_uint32_t
                *radixsort)

{
  ResultBuilder *pRVar1;
  long lVar2;
  unsigned_long *puVar3;
  unsigned_long *rhs;
  uint32_t out;
  SourceLineInfo local_dd0;
  uint32_t (*local_da8) [8];
  int local_d9c;
  uint32_t indices [2] [8];
  unsigned_long keys_copy [8];
  unsigned_long keys [2] [8];
  ResultBuilder __catchResult;
  type rng;
  
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine(&rng);
  rand_keys(&rng,keys[0],indices[0],keys_copy,8);
  out = (*radixsort)(keys[0],keys[1],indices[0],indices[1],8);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_dd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bitshifter[P]radixsort/test/test_common.hpp"
             ,0x53);
  Catch::ResultBuilder::ResultBuilder(&__catchResult,"REQUIRE",&local_dd0,"out < 2",Normal,"");
  std::__cxx11::string::~string((string *)&local_dd0);
  local_dd0.file._M_string_length = (size_type)&out;
  local_d9c = 2;
  local_dd0.file._M_dataplus._M_p = (pointer)&__catchResult;
  pRVar1 = Catch::ExpressionLhs<unsigned_int_const&>::
           captureExpression<(Catch::Internal::Operator)2,int>
                     ((ExpressionLhs<unsigned_int_const&> *)&local_dd0,&local_d9c);
  Catch::ResultBuilder::endExpression(pRVar1);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  local_da8 = indices + out;
  lVar2 = 1;
  puVar3 = keys[out];
  for (; lVar2 != 8; lVar2 = lVar2 + 1) {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_dd0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bitshifter[P]radixsort/test/test_common.hpp"
               ,0x5a);
    Catch::ResultBuilder::ResultBuilder
              (&__catchResult,"REQUIRE",&local_dd0,"keys_out[i - 1] <= keys_out[i]",Normal,"");
    std::__cxx11::string::~string((string *)&local_dd0);
    rhs = puVar3 + 1;
    local_dd0.file._M_dataplus._M_p = (pointer)&__catchResult;
    local_dd0.file._M_string_length = (size_type)puVar3;
    pRVar1 = Catch::ExpressionLhs<unsigned_long_const&>::
             captureExpression<(Catch::Internal::Operator)4,unsigned_long>
                       ((ExpressionLhs<unsigned_long_const&> *)&local_dd0,rhs);
    Catch::ResultBuilder::endExpression(pRVar1);
    Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
    Catch::ResultBuilder::react(&__catchResult);
    Catch::ResultBuilder::~ResultBuilder(&__catchResult);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_dd0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bitshifter[P]radixsort/test/test_common.hpp"
               ,0x5b);
    Catch::ResultBuilder::ResultBuilder
              (&__catchResult,"REQUIRE",&local_dd0,"keys_out[i] == keys_copy[indices_out[i]]",Normal
               ,"");
    std::__cxx11::string::~string((string *)&local_dd0);
    local_dd0.file._M_dataplus._M_p = (pointer)&__catchResult;
    local_dd0.file._M_string_length = (size_type)rhs;
    pRVar1 = Catch::ExpressionLhs<unsigned_long_const&>::
             captureExpression<(Catch::Internal::Operator)0,unsigned_long>
                       ((ExpressionLhs<unsigned_long_const&> *)&local_dd0,
                        keys_copy + (*local_da8)[lVar2]);
    Catch::ResultBuilder::endExpression(pRVar1);
    Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
    Catch::ResultBuilder::react(&__catchResult);
    Catch::ResultBuilder::~ResultBuilder(&__catchResult);
    puVar3 = rhs;
  }
  return;
}

Assistant:

void test_radixsort(uint32_t (*radixsort)(KeyType*, KeyType*, ValueType*, ValueType*, uint32_t))
{
    static const size_t array_size = N;
    typename RngType<KeyType>::type rng;
    KeyType keys[2][array_size];
    KeyType keys_copy[array_size];
    uint32_t indices[2][array_size];

    rand_keys(rng, keys[0], indices[0], keys_copy, array_size);
    auto out = radixsort(keys[0], keys[1], indices[0], indices[1], array_size);

    REQUIRE(out < 2);

    const KeyType* keys_out = keys[out];
    const uint32_t* indices_out = indices[out];

    for (uint32_t i = 1; i < array_size; ++i)
    {
        REQUIRE(keys_out[i - 1] <= keys_out[i]);
        REQUIRE(keys_out[i] == keys_copy[indices_out[i]]);
    }
}